

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int plain_method_len(char *method,size_t method_len)

{
  int iVar1;
  size_t method_len_local;
  char *method_local;
  
  iVar1 = strncmp("ecdsa-sha2-nistp256-cert-v01@openssh.com",method,method_len);
  if (((iVar1 != 0) &&
      (iVar1 = strncmp("ecdsa-sha2-nistp384-cert-v01@openssh.com",method,method_len), iVar1 != 0))
     && (iVar1 = strncmp("ecdsa-sha2-nistp521-cert-v01@openssh.com",method,method_len), iVar1 != 0))
  {
    return (int)method_len;
  }
  return 0x13;
}

Assistant:

static int plain_method_len(const char *method, size_t method_len)
{
    if(!strncmp("ecdsa-sha2-nistp256-cert-v01@openssh.com",
                method,
                method_len) ||
       !strncmp("ecdsa-sha2-nistp384-cert-v01@openssh.com",
                method,
                method_len) ||
       !strncmp("ecdsa-sha2-nistp521-cert-v01@openssh.com",
                method,
                method_len)) {
        return 19;
    }
    return method_len;
}